

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O3

size_t __thiscall Apt::GetEdgeBetweenNodes(Apt *this,size_t idxA,size_t idxB)

{
  pointer pTVar1;
  size_t *psVar2;
  pointer pTVar3;
  size_t sVar4;
  ulong uVar5;
  size_t *psVar6;
  size_t sVar7;
  
  pTVar1 = (this->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(this->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>._M_impl
                .super__Vector_impl_data._M_finish - (long)pTVar1 >> 6;
  if (uVar5 <= idxA) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",idxA,
               uVar5);
  }
  psVar6 = *(size_t **)
            &pTVar1[idxA].vecEdges.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl;
  psVar2 = *(pointer *)
            ((long)&pTVar1[idxA].vecEdges.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8);
  if (psVar6 != psVar2) {
    pTVar3 = (this->vecTaxiEdges).super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      sVar4 = *psVar6;
      sVar7 = pTVar3[sVar4].a;
      if (sVar7 == idxA) {
        sVar7 = pTVar3[sVar4].b;
      }
      if (sVar7 == idxB) {
        return sVar4;
      }
      psVar6 = psVar6 + 1;
    } while (psVar6 != psVar2);
  }
  return 0xfffffffffffffffe;
}

Assistant:

size_t GetEdgeBetweenNodes (size_t idxA, size_t idxB)
    {
        const TaxiNode& a = vecTaxiNodes.at(idxA);
        for (size_t idxE: a.vecEdges) {
            const TaxiEdge& e = vecTaxiEdges[idxE];
            if (e.otherNode(idxA) == idxB)
                return idxE;
        }
        return EDGE_UNAVAIL;
    }